

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screrror.cpp
# Opt level: O3

HRESULT MapHr(HRESULT hr,ErrorTypeEnum *errorTypeOut)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  HRESULT HVar5;
  undefined4 *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  if (MapHr(int,ErrorTypeEnum*)::fCheckSort == '\0') {
    MapHr(int,ErrorTypeEnum*)::fCheckSort = '\x01';
    lVar10 = 0xc;
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    uVar9 = 0x80004001;
    do {
      uVar1 = *(uint *)((long)&g_rgmhr[0].hrIn + lVar10);
      if (uVar1 <= uVar9) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/screrror.cpp"
                           ,0x8e,"((uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn)",
                           "(uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar6 = 0;
      }
      lVar10 = lVar10 + 0xc;
      uVar9 = uVar1;
    } while (lVar10 != 0x228);
  }
  if (errorTypeOut != (ErrorTypeEnum *)0x0) {
    *errorTypeOut = kjstError;
  }
  HVar5 = 0;
  if ((hr < 0) && (HVar5 = hr, (hr & 0x1fff0000U) != 0xa0000)) {
    iVar4 = 0;
    iVar7 = 0x2e;
    do {
      iVar8 = (iVar7 + iVar4) / 2;
      if ((uint)g_rgmhr[iVar8].hrIn < (uint)hr) {
        iVar4 = iVar8 + 1;
        iVar8 = iVar7;
      }
      iVar7 = iVar8;
    } while (iVar4 < iVar7);
    if ((iVar4 < 0x2e) && (g_rgmhr[iVar4].hrIn == hr)) {
      if (errorTypeOut != (ErrorTypeEnum *)0x0) {
        *errorTypeOut = g_rgmhr[iVar4].errorType;
      }
      HVar5 = g_rgmhr[iVar4].hrOut;
    }
  }
  return HVar5;
}

Assistant:

HRESULT MapHr(HRESULT hr, ErrorTypeEnum * errorTypeOut)
{
    int imhrMin, imhrLim, imhr;

#if DEBUG
    // In debug, check that all the entries in the error map table are
    // sorted based on the HRESULT in ascending order. We will then binary
    // search the sorted array. We need do this only once per invocation.
    static BOOL fCheckSort = TRUE;

    if (fCheckSort)
    {
        fCheckSort = FALSE;
        for (imhr = 1; imhr < kcmhr; imhr++)
            Assert((uint32)g_rgmhr[imhr - 1].hrIn < (uint32)g_rgmhr[imhr].hrIn);
    }
#endif // DEBUG

    if (errorTypeOut != nullptr)
    {
        *errorTypeOut = kjstError;
    }

    if (SUCCEEDED(hr))
        return NOERROR;

    if (FACILITY_CONTROL == HRESULT_FACILITY(hr))
        return hr;

    for (imhrMin = 0, imhrLim = kcmhr; imhrMin < imhrLim; )
    {
        imhr = (imhrMin + imhrLim) / 2;
        if ((uint32)g_rgmhr[imhr].hrIn < (uint32)hr)
            imhrMin = imhr + 1;
        else
            imhrLim = imhr;
    }
    if (imhrMin < kcmhr && hr == g_rgmhr[imhrMin].hrIn)
    {
        if (errorTypeOut != nullptr)
        {
            *errorTypeOut = g_rgmhr[imhrMin].errorType;
        }

        return g_rgmhr[imhrMin].hrOut;
    }

    return hr;
}